

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

void CalculatePercentilesByWeight
               (CAmount *result,
               vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *scores,
               int64_t total_weight)

{
  pointer ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  long lVar8;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__range1;
  long in_FS_OFFSET;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_58 [5];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar6 = (scores->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (scores->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    uVar4 = (long)ppVar1 - (long)ppVar6 >> 4;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar6,ppVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar6);
    dVar9 = (double)total_weight;
    local_58[0] = dVar9 / 10.0;
    local_58[1] = dVar9 * 0.25;
    local_58[2] = dVar9 * 0.5;
    local_58[3] = dVar9 * 3.0 * 0.25;
    local_58[4] = (dVar9 * 9.0) / 10.0;
    ppVar6 = (scores->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (scores->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar5 = 0;
    if (ppVar6 != ppVar1) {
      lVar7 = 0;
      do {
        lVar7 = lVar7 + ppVar6->second;
        if (lVar5 < 5) {
          do {
            if ((double)lVar7 < local_58[lVar5]) goto LAB_009a0393;
            result[lVar5] = ppVar6->first;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 5);
          lVar5 = 5;
        }
LAB_009a0393:
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar1);
      if (4 < lVar5) goto LAB_009a0447;
    }
    auVar3 = _DAT_00e73190;
    auVar2 = _DAT_00e73180;
    lVar7 = ppVar1[-1].first;
    lVar8 = 4 - lVar5;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar4 = 0;
    auVar10 = auVar10 ^ _DAT_00e73190;
    do {
      auVar11._8_4_ = (int)uVar4;
      auVar11._0_8_ = uVar4;
      auVar11._12_4_ = (int)(uVar4 >> 0x20);
      auVar11 = (auVar11 | auVar2) ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                  auVar10._4_4_ < auVar11._4_4_) & 1)) {
        result[lVar5 + uVar4] = lVar7;
      }
      if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
          auVar11._12_4_ <= auVar10._12_4_) {
        result[lVar5 + uVar4 + 1] = lVar7;
      }
      uVar4 = uVar4 + 2;
    } while ((6U - lVar5 & 0xfffffffffffffffe) != uVar4);
  }
LAB_009a0447:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CalculatePercentilesByWeight(CAmount result[NUM_GETBLOCKSTATS_PERCENTILES], std::vector<std::pair<CAmount, int64_t>>& scores, int64_t total_weight)
{
    if (scores.empty()) {
        return;
    }

    std::sort(scores.begin(), scores.end());

    // 10th, 25th, 50th, 75th, and 90th percentile weight units.
    const double weights[NUM_GETBLOCKSTATS_PERCENTILES] = {
        total_weight / 10.0, total_weight / 4.0, total_weight / 2.0, (total_weight * 3.0) / 4.0, (total_weight * 9.0) / 10.0
    };

    int64_t next_percentile_index = 0;
    int64_t cumulative_weight = 0;
    for (const auto& element : scores) {
        cumulative_weight += element.second;
        while (next_percentile_index < NUM_GETBLOCKSTATS_PERCENTILES && cumulative_weight >= weights[next_percentile_index]) {
            result[next_percentile_index] = element.first;
            ++next_percentile_index;
        }
    }

    // Fill any remaining percentiles with the last value.
    for (int64_t i = next_percentile_index; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        result[i] = scores.back().first;
    }
}